

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O2

void __thiscall Serializer_Normal_Test::TestBody(Serializer_Normal_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Serializer obj2;
  Serializer obj;
  string local_80;
  Serializer builder;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  cfd::core::Serializer::Serializer(&builder);
  cfd::core::Serializer::AddDirectNumber(&builder,1);
  cfd::core::Serializer::AddDirectNumber(&builder,2);
  cfd::core::Serializer::AddDirectByte(&builder,'\x03');
  cfd::core::Serializer::AddVariableInt(&builder,0x1ffff);
  std::__cxx11::string::string((string *)&obj,"f1f2",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&obj2,(string *)&obj);
  cfd::core::Serializer::AddVariableBuffer(&builder,(ByteData *)&obj2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&obj2);
  std::__cxx11::string::~string((string *)&obj);
  std::__cxx11::string::string((string *)&obj,"d1d2d3d4",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&obj2,(string *)&obj);
  cfd::core::Serializer::AddPrefixBuffer(&builder,0xe1e2e3e4,(ByteData *)&obj2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&obj2);
  std::__cxx11::string::~string((string *)&obj);
  std::__cxx11::string::string((string *)&obj,"c1c2c3c4",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&obj2,(string *)&obj);
  cfd::core::Serializer::AddDirectBytes(&builder,(ByteData *)&obj2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&obj2);
  std::__cxx11::string::~string((string *)&obj);
  cfd::core::Serializer::Output((ByteData *)&obj2,&builder);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&obj,(ByteData *)&obj2);
  testing::internal::CmpHelperEQ<char[71],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex()",
             (char (*) [71])"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj);
  std::__cxx11::string::~string((string *)&obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&obj2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&obj);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&obj2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x18,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&obj2,(Message *)&obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&obj2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&obj);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Serializer::Serializer(&obj,&builder);
  cfd::core::Serializer::Serializer(&obj2);
  cfd::core::Serializer::operator=(&obj2,&builder);
  cfd::core::Serializer::Output((ByteData *)&local_20,&builder);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&local_20);
  cfd::core::Serializer::Output((ByteData *)&local_38,&obj);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,(ByteData *)&local_38);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"builder.Output().GetHex()","obj.Output().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Serializer::Output((ByteData *)&local_20,&builder);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&local_20);
  cfd::core::Serializer::Output((ByteData *)&local_38,&obj2);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,(ByteData *)&local_38);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"builder.Output().GetHex()","obj2.Output().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Serializer::~Serializer(&obj2);
  cfd::core::Serializer::~Serializer(&obj);
  cfd::core::Serializer::~Serializer(&builder);
  return;
}

Assistant:

TEST(Serializer, Normal) {
  Serializer builder;
  builder.AddDirectNumber(uint32_t{1});
  builder.AddDirectNumber(uint64_t{2});
  builder.AddDirectByte(3);
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder.AddDirectBytes(ByteData("c1c2c3c4"));

  EXPECT_EQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());

  Serializer obj(builder);
  Serializer obj2;
  obj2 = builder;
  EXPECT_EQ(builder.Output().GetHex(), obj.Output().GetHex());
  EXPECT_EQ(builder.Output().GetHex(), obj2.Output().GetHex());
}